

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O2

void __thiscall
tcmalloc::ThreadCache::ReleaseToCentralCache(ThreadCache *this,ThreadCacheFreeList *fl,int N)

{
  ulong uVar1;
  int N_00;
  ulong uVar2;
  int N_01;
  FreeList central_fl;
  FreeList local_48;
  
  uVar1 = (fl->list_).free_count_;
  uVar2 = (ulong)(uint)N;
  if ((uint)uVar1 < (uint)N) {
    uVar2 = uVar1 & 0xffffffff;
  }
  if (0 < (int)uVar2) {
    this->size_ = this->size_ - (long)((int)fl->obj_bytes_ * (int)uVar2);
    N_00 = (int)*(undefined8 *)(&DAT_00108120 + (long)fl->cl_ * 0x18);
    while( true ) {
      N_01 = (int)uVar2;
      uVar2 = (ulong)(uint)(N_01 - N_00);
      if (N_01 - N_00 == 0 || N_01 < N_00) break;
      local_48.free_count_ = 0;
      local_48.head_ = (void *)0x0;
      ThreadCacheFreeList::PopFreeList(fl,N_00,&local_48);
      CentralFreelist::ReleaseFreeList
                ((CentralFreelist *)(central_freelists + (long)fl->cl_ * 0x4f0),&local_48,(long)N_00
                );
    }
    local_48.free_count_ = 0;
    local_48.head_ = (void *)0x0;
    ThreadCacheFreeList::PopFreeList(fl,N_01,&local_48);
    CentralFreelist::ReleaseFreeList
              ((CentralFreelist *)(central_freelists + (long)fl->cl_ * 0x4f0),&local_48,(long)N_01);
  }
  return;
}

Assistant:

void* Alloc(size_t size, uint64_t cl) {
        assert(0 < cl && cl < kMaxClass);
        void* rv;
        if (!freelists_[cl].TryPop(&rv)) {
            FetchFromCentralCache(freelists_[cl]);
            freelists_[cl].TryPop(&rv);
        }
        size = ClassSize(cl);
        size_ -= size;
        total_alloc_ += size;
        return rv;
    }